

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_smooth_h_predictor_64x64_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  long lVar2;
  int c;
  long lVar3;
  long lVar4;
  byte local_14 [3];
  uint8_t local_11;
  uint8_t weights [2];
  uint8_t pixels [2];
  
  local_11 = above[0x3f];
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      local_14[2] = left[lVar2];
      local_14[0] = smooth_weights[lVar3 + 0x3c];
      local_14[1] = -smooth_weights[lVar3 + 0x3c];
      lVar4 = 0;
      iVar1 = 0;
      do {
        iVar1 = iVar1 + (uint)local_14[lVar4 + 2] * (uint)local_14[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      dst[lVar3] = (uint8_t)((uint)(iVar1 + 0x80) >> 8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    dst = dst + stride;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  return;
}

Assistant:

static inline void smooth_h_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint8_t *above,
                                      const uint8_t *left) {
  const uint8_t right_pred = above[bw - 1];  // estimated by top-right pixel
  const uint8_t *const sm_weights = smooth_weights + bw - 4;
  // scale = 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights, sm_weights, scale,
                           log2_scale + sizeof(*dst));

  int r;
  for (r = 0; r < bh; r++) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint8_t pixels[] = { left[r], right_pred };
      const uint8_t weights[] = { sm_weights[c], scale - sm_weights[c] };
      uint32_t this_pred = 0;
      assert(scale >= sm_weights[c]);
      int i;
      for (i = 0; i < 2; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}